

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngvalid.c
# Opt level: O0

void store_read_imp(png_store *ps,png_bytep pb,size_t st)

{
  int iVar1;
  size_t sVar2;
  size_t local_28;
  size_t cbAvail;
  size_t st_local;
  png_bytep pb_local;
  png_store *ps_local;
  
  cbAvail = st;
  st_local = (size_t)pb;
  if ((ps->current == (png_store_file *)0x0) || (ps->next == (png_store_buffer *)0x0)) {
    png_error(ps->pread,"store state damaged");
  }
  while (cbAvail != 0) {
    sVar2 = store_read_buffer_size(ps);
    local_28 = sVar2 - ps->readpos;
    if (local_28 == 0) {
      iVar1 = store_read_buffer_next(ps);
      if (iVar1 == 0) {
        png_error(ps->pread,"read beyond end of file");
      }
    }
    else {
      if (cbAvail < local_28) {
        local_28 = cbAvail;
      }
      memcpy((void *)st_local,ps->next->buffer + ps->readpos,local_28);
      cbAvail = cbAvail - local_28;
      st_local = local_28 + st_local;
      ps->readpos = local_28 + ps->readpos;
    }
  }
  return;
}

Assistant:

static void
store_read_imp(png_store *ps, png_bytep pb, size_t st)
{
   if (ps->current == NULL || ps->next == NULL)
      png_error(ps->pread, "store state damaged");

   while (st > 0)
   {
      size_t cbAvail = store_read_buffer_size(ps) - ps->readpos;

      if (cbAvail > 0)
      {
         if (cbAvail > st) cbAvail = st;
         memcpy(pb, ps->next->buffer + ps->readpos, cbAvail);
         st -= cbAvail;
         pb += cbAvail;
         ps->readpos += cbAvail;
      }

      else if (!store_read_buffer_next(ps))
         png_error(ps->pread, "read beyond end of file");
   }
}